

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetCursorPosYAndSetupDummyPrevLine(float pos_y,float line_height)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumnsSet *pIVar3;
  ImGuiContext *pIVar4;
  
  ImGui::SetCursorPosY(pos_y);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  fVar1 = (pIVar2->DC).CursorPos.y;
  (pIVar2->DC).CursorPosPrevLine.y = fVar1 - line_height;
  (pIVar2->DC).PrevLineHeight = line_height - (pIVar4->Style).ItemSpacing.y;
  pIVar3 = (pIVar2->DC).ColumnsSet;
  if (pIVar3 != (ImGuiColumnsSet *)0x0) {
    pIVar3->LineMinY = fVar1;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupDummyPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHere() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGui::SetCursorPosY(pos_y);
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;      // Setting those fields so that SetScrollHere() can properly function after the end of our clipper usage.
    window->DC.PrevLineHeight = (line_height - GImGui->Style.ItemSpacing.y);    // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (window->DC.ColumnsSet)
        window->DC.ColumnsSet->LineMinY = window->DC.CursorPos.y;           // Setting this so that cell Y position are set properly
}